

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ValidateMessage(Parser *this,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this_00;
  Parser *this_01;
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *descriptor;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar2;
  int index;
  undefined1 *puVar3;
  int col;
  int line;
  int local_40;
  int local_3c;
  Parser *local_38;
  
  puVar3 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((MessageOptions *)puVar3 == (MessageOptions *)0x0) {
    puVar3 = _MessageOptions_default_instance_;
  }
  if (0 < *(int *)((long)&((MessageOptions *)puVar3)->field_0 + 0x28)) {
    index = 0;
    local_38 = this;
    do {
      descriptor = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                             (&(((MessageOptions *)puVar3)->field_0)._impl_.uninterpreted_option_.
                               super_RepeatedPtrFieldBase,index);
      if (0 < *(int *)((long)&descriptor->field_0 + 0x10)) {
        this_00 = &(descriptor->field_0)._impl_.name_;
        pVVar2 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                           (&this_00->super_RepeatedPtrFieldBase,0);
        if ((pVVar2->field_0)._impl_.is_extension_ == false) {
          pVVar2 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          iVar1 = std::__cxx11::string::compare
                            ((char *)((ulong)(pVVar2->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
          this_01 = local_38;
          if (iVar1 == 0) {
            local_3c = -1;
            local_40 = 0;
            if (local_38->source_location_table_ != (SourceLocationTable *)0x0) {
              SourceLocationTable::Find
                        (local_38->source_location_table_,&descriptor->super_Message,OPTION_NAME,
                         &local_3c,&local_40);
            }
            RecordError(this_01,local_3c,local_40,(ErrorMaker)ZEXT816(0x3d75ad));
            return false;
          }
        }
      }
      puVar3 = (undefined1 *)(proto->field_0)._impl_.options_;
      if ((MessageOptions *)puVar3 == (MessageOptions *)0x0) {
        puVar3 = _MessageOptions_default_instance_;
      }
      index = index + 1;
    } while (index < *(int *)((long)&((MessageOptions *)puVar3)->field_0 + 0x28));
  }
  return true;
}

Assistant:

bool Parser::ValidateMessage(const DescriptorProto* proto) {
  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption& option =
        proto->options().uninterpreted_option(i);
    if (option.name_size() > 0 && !option.name(0).is_extension() &&
        option.name(0).name_part() == "map_entry") {
      int line = -1, col = 0;  // indicates line and column not known
      if (source_location_table_ != nullptr) {
        source_location_table_->Find(
            &option, DescriptorPool::ErrorCollector::OPTION_NAME, &line, &col);
      }
      RecordError(line, col,
                  "map_entry should not be set explicitly. "
                  "Use map<KeyType, ValueType> instead.");
      return false;
    }
  }
  return true;
}